

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk60(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  envy_bios_power_unk60_entry *peVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  uVar7 = (bios->power).unk60.offset;
  iVar10 = -0x16;
  if ((ulong)uVar7 != 0) {
    if (uVar7 < bios->length) {
      (bios->power).unk60.version = bios->data[uVar7];
    }
    else {
      (bios->power).unk60.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar1 = (bios->power).unk60.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      uVar7 = (bios->power).unk60.offset + 1;
      if (uVar7 < bios->length) {
        (bios->power).unk60.hlen = bios->data[uVar7];
        iVar10 = 0;
      }
      else {
        (bios->power).unk60.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar10 = -0xe;
      }
      uVar7 = (bios->power).unk60.offset + 2;
      if (uVar7 < bios->length) {
        (bios->power).unk60.rlen = bios->data[uVar7];
        iVar8 = 0;
      }
      else {
        (bios->power).unk60.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar8 = -0xe;
      }
      uVar7 = (bios->power).unk60.offset + 3;
      if (uVar7 < bios->length) {
        (bios->power).unk60.entriesnum = bios->data[uVar7];
        iVar4 = 0;
      }
      else {
        (bios->power).unk60.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      (bios->power).unk60.valid = (iVar8 == 0 && iVar10 == 0) && iVar4 == 0;
      bVar2 = (bios->power).unk60.entriesnum;
      peVar5 = (envy_bios_power_unk60_entry *)malloc((ulong)((uint)bVar2 * 4));
      (bios->power).unk60.entries = peVar5;
      if (bVar2 == 0) {
        iVar10 = 0;
      }
      else {
        uVar6 = (uint)(bios->power).unk60.hlen + (bios->power).unk60.offset;
        bVar3 = (bios->power).unk60.rlen;
        iVar10 = 0;
        uVar9 = 0;
        do {
          peVar5[uVar9].offset = uVar6;
          uVar9 = uVar9 + 1;
          uVar6 = uVar6 + bVar3;
        } while (bVar2 != uVar9);
      }
    }
    else {
      fprintf(_stderr,"Unknown DI/DT table version 0x%x\n");
    }
  }
  return iVar10;
}

Assistant:

int envy_bios_parse_power_unk60(struct envy_bios *bios) {
	struct envy_bios_power_unk60 *unk60 = &bios->power.unk60;
	int i, err = 0;

	if (!unk60->offset)
		return -EINVAL;

	bios_u8(bios, unk60->offset + 0x0, &unk60->version);
	switch(unk60->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk60->offset + 0x1, &unk60->hlen);
		err |= bios_u8(bios, unk60->offset + 0x2, &unk60->rlen);
		err |= bios_u8(bios, unk60->offset + 0x3, &unk60->entriesnum);
		unk60->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown DI/DT table version 0x%x\n", unk60->version);
		return -EINVAL;
	};

	err = 0;
	unk60->entries = malloc(unk60->entriesnum * sizeof(struct envy_bios_power_unk60_entry));
	for (i = 0; i < unk60->entriesnum; i++) {
		uint32_t data = unk60->offset + unk60->hlen + i * unk60->rlen;

		unk60->entries[i].offset = data;
	}

	return 0;
}